

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall leveldb::VersionSet::Builder::~Builder(Builder *this)

{
  int iVar1;
  _Rb_tree<leveldb::FileMetaData_*,_leveldb::FileMetaData_*,_std::_Identity<leveldb::FileMetaData_*>,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
  *this_00;
  FileMetaData *this_01;
  _Base_ptr p_Var2;
  int level;
  long lVar3;
  uint uVar4;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> to_unref;
  _Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> local_48;
  
  for (lVar3 = 0; lVar3 != 7; lVar3 = lVar3 + 1) {
    this_00 = &(this->levels_[lVar3].added_files)->_M_t;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               &local_48,(this_00->_M_impl).super__Rb_tree_header._M_node_count);
    for (p_Var2 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this_00->_M_impl).super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 &local_48,(value_type *)(p_Var2 + 1));
    }
    std::
    _Rb_tree<leveldb::FileMetaData_*,_leveldb::FileMetaData_*,_std::_Identity<leveldb::FileMetaData_*>,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
    ::~_Rb_tree(this_00);
    operator_delete(this_00);
    uVar4 = 0;
    while( true ) {
      if ((ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)uVar4)
      break;
      this_01 = local_48._M_impl.super__Vector_impl_data._M_start[uVar4];
      iVar1 = this_01->refs;
      this_01->refs = iVar1 + -1;
      if (iVar1 < 2) {
        FileMetaData::~FileMetaData(this_01);
        operator_delete(this_01);
      }
      uVar4 = uVar4 + 1;
    }
    std::_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
    ~_Vector_base(&local_48);
  }
  Version::Unref(this->base_);
  lVar3 = 0x160;
  do {
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)((long)this->levels_ + lVar3 + -0x10));
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != -0x28);
  return;
}

Assistant:

~Builder() {
    for (int level = 0; level < config::kNumLevels; level++) {
      const FileSet* added = levels_[level].added_files;
      std::vector<FileMetaData*> to_unref;
      to_unref.reserve(added->size());
      for (FileSet::const_iterator it = added->begin(); it != added->end();
           ++it) {
        to_unref.push_back(*it);
      }
      delete added;
      for (uint32_t i = 0; i < to_unref.size(); i++) {
        FileMetaData* f = to_unref[i];
        f->refs--;
        if (f->refs <= 0) {
          delete f;
        }
      }
    }
    base_->Unref();
  }